

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::Edition::Clear(Edition *this)

{
  int iVar1;
  
  iVar1 = this->m_atoms_count;
  while (0 < iVar1) {
    this->m_atoms_count = iVar1 - 1U;
    Atom::Clear(this->m_atoms + (iVar1 - 1U));
    iVar1 = this->m_atoms_count;
  }
  if (this->m_atoms != (Atom *)0x0) {
    operator_delete__(&this->m_atoms[-1].m_displays_size);
  }
  this->m_atoms = (Atom *)0x0;
  this->m_atoms_size = 0;
  return;
}

Assistant:

void Chapters::Edition::Clear() {
  while (m_atoms_count > 0) {
    Atom& a = m_atoms[--m_atoms_count];
    a.Clear();
  }

  delete[] m_atoms;
  m_atoms = NULL;

  m_atoms_size = 0;
}